

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

AsinLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_asin(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x2da) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2da;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    AsinLayerParams::AsinLayerParams(this_00.asin_);
    (this->layer_).asin_ = (AsinLayerParams *)this_00;
  }
  return (AsinLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::AsinLayerParams* NeuralNetworkLayer::mutable_asin() {
  if (!has_asin()) {
    clear_layer();
    set_has_asin();
    layer_.asin_ = new ::CoreML::Specification::AsinLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.asin)
  return layer_.asin_;
}